

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::trivialHeuristic(SPxMainSM<double> *this,SPxLPBase<double> *lp)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  double *pdVar7;
  element_type *peVar8;
  SVectorBase<double> *this_00;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  VectorBase<double> *in_RSI;
  long in_RDI;
  double dVar9;
  Real RVar10;
  double dVar11;
  double upper;
  double lower;
  double aij;
  int k;
  SVectorBase<double> *col;
  int j;
  double largeValue;
  bool zerovalid;
  double lockObj;
  double upperObj;
  double lowerObj;
  double zeroObj;
  VectorBase<double> downLocks;
  VectorBase<double> upLocks;
  VectorBase<double> locksol;
  VectorBase<double> uppersol;
  VectorBase<double> lowersol;
  VectorBase<double> zerosol;
  undefined4 in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  SPxLPBase<double> *in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffafc;
  uint uVar12;
  VectorBase<double> *in_stack_fffffffffffffb00;
  bool local_4f2;
  SPxMainSM<double> *in_stack_fffffffffffffb10;
  VectorBase<double> *in_stack_fffffffffffffb48;
  SPxLPBase<double> *in_stack_fffffffffffffb50;
  SPxMainSM<double> *in_stack_fffffffffffffb58;
  double local_400;
  double local_3c0;
  bool local_2a1;
  double local_168;
  double local_160;
  uint local_104;
  int local_f4;
  double local_e0;
  double local_d0;
  double local_c8;
  double local_c0;
  
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b2e94);
  VectorBase<double>::VectorBase(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b2eb0);
  VectorBase<double>::VectorBase(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b2edc);
  VectorBase<double>::VectorBase(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b2f08);
  VectorBase<double>::VectorBase(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b2f34);
  VectorBase<double>::VectorBase(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b2f60);
  VectorBase<double>::VectorBase(in_stack_fffffffffffffb00,in_stack_fffffffffffffafc);
  dVar1 = *(double *)(in_RDI + 0x38);
  local_c0 = *(double *)(in_RDI + 0x38);
  local_c8 = *(double *)(in_RDI + 0x38);
  local_d0 = *(double *)(in_RDI + 0x38);
  bVar3 = true;
  pdVar7 = (double *)infinity();
  local_e0 = *pdVar7;
  dVar9 = feastol(in_stack_fffffffffffffb10);
  pdVar7 = (double *)infinity();
  dVar11 = *pdVar7;
  SPxSimplifier<double>::tolerances
            ((SPxSimplifier<double> *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8))
  ;
  peVar8 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2b304b);
  RVar10 = Tolerances::epsilon(peVar8);
  bVar4 = LT<double,double,double>(1.0 / dVar9,dVar11,RVar10);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2b3092);
  if (bVar4) {
    local_e0 = feastol(in_stack_fffffffffffffb10);
    local_e0 = 1.0 / local_e0;
  }
  local_f4 = SPxLPBase<double>::nCols((SPxLPBase<double> *)0x2b31a6);
  do {
    local_f4 = local_f4 + -1;
    if (local_f4 < 0) {
      VectorBase<double>::VectorBase
                ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                 (VectorBase<double> *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                );
      bVar4 = checkSolution(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                            in_stack_fffffffffffffb48);
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b4095);
      if ((bVar4) &&
         (*(double *)(in_RDI + 0x1c8) <= local_c0 && local_c0 != *(double *)(in_RDI + 0x1c8))) {
        *(double *)(in_RDI + 0x1c8) = local_c0;
      }
      VectorBase<double>::VectorBase
                ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                 (VectorBase<double> *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                );
      bVar4 = checkSolution(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                            in_stack_fffffffffffffb48);
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b414e);
      if ((bVar4) &&
         (*(double *)(in_RDI + 0x1c8) <= local_c8 && local_c8 != *(double *)(in_RDI + 0x1c8))) {
        *(double *)(in_RDI + 0x1c8) = local_c8;
      }
      local_4f2 = false;
      if (bVar3) {
        VectorBase<double>::VectorBase
                  ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                   (VectorBase<double> *)
                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        local_4f2 = checkSolution(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                                  in_stack_fffffffffffffb48);
      }
      uVar12 = (uint)local_4f2 << 0x10;
      if (bVar3) {
        VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b4247);
      }
      if (((uVar12 & 0x10000) != 0) &&
         (*(double *)(in_RDI + 0x1c8) <= dVar1 && dVar1 != *(double *)(in_RDI + 0x1c8))) {
        *(double *)(in_RDI + 0x1c8) = dVar1;
      }
      VectorBase<double>::VectorBase
                (in_RSI,(VectorBase<double> *)
                        CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      bVar5 = checkSolution(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50,
                            in_stack_fffffffffffffb48);
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b430c);
      if (((bVar5 & 1) != 0) &&
         (*(double *)(in_RDI + 0x1c8) <= local_d0 && local_d0 != *(double *)(in_RDI + 0x1c8))) {
        *(double *)(in_RDI + 0x1c8) = local_d0;
      }
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b437e);
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b438b);
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b4398);
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b43a5);
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b43b2);
      VectorBase<double>::~VectorBase((VectorBase<double> *)0x2b43bf);
      return;
    }
    pdVar7 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    *pdVar7 = 0.0;
    pdVar7 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    *pdVar7 = 0.0;
    this_00 = SPxLPBase<double>::colVector(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    for (local_104 = 0; iVar6 = SVectorBase<double>::size(this_00), (int)local_104 < iVar6;
        local_104 = local_104 + 1) {
      pdVar7 = SVectorBase<double>::value(this_00,local_104);
      dVar11 = *pdVar7;
      SVectorBase<double>::index(this_00,(char *)(ulong)local_104,__c);
      pdVar7 = SPxLPBase<double>::lhs(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
      dVar9 = *pdVar7;
      pdVar7 = (double *)infinity();
      dVar2 = *pdVar7;
      SPxSimplifier<double>::tolerances
                ((SPxSimplifier<double> *)
                 CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      peVar8 = std::
               __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2b334f);
      RVar10 = Tolerances::epsilon(peVar8);
      bVar4 = GT<double,double,double>(dVar9,-dVar2,RVar10);
      local_2a1 = false;
      if (bVar4) {
        SVectorBase<double>::index(this_00,(char *)(ulong)local_104,__c_00);
        pdVar7 = SPxLPBase<double>::rhs(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
        dVar9 = *pdVar7;
        pdVar7 = (double *)infinity();
        dVar2 = *pdVar7;
        SPxSimplifier<double>::tolerances
                  ((SPxSimplifier<double> *)
                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        peVar8 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2b342d);
        RVar10 = Tolerances::epsilon(peVar8);
        local_2a1 = LT<double,double,double>(dVar9,dVar2,RVar10);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2b348e)
        ;
      }
      std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2b349b);
      if (local_2a1 == false) {
        SVectorBase<double>::index(this_00,(char *)(ulong)local_104,__c_01);
        pdVar7 = SPxLPBase<double>::lhs(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
        dVar9 = *pdVar7;
        pdVar7 = (double *)infinity();
        dVar2 = *pdVar7;
        SPxSimplifier<double>::tolerances
                  ((SPxSimplifier<double> *)
                   CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        peVar8 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x2b3610);
        RVar10 = Tolerances::epsilon(peVar8);
        bVar4 = GT<double,double,double>(dVar9,-dVar2,RVar10);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2b3657)
        ;
        if (bVar4) {
          if (dVar11 <= 0.0) {
            if (dVar11 < 0.0) {
              pdVar7 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                                  in_stack_fffffffffffffaec);
              *pdVar7 = *pdVar7 + 1.0;
            }
          }
          else {
            pdVar7 = VectorBase<double>::operator[]
                               ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                                in_stack_fffffffffffffaec);
            *pdVar7 = *pdVar7 + 1.0;
          }
        }
        else {
          SVectorBase<double>::index(this_00,(char *)(ulong)local_104,__c_02);
          pdVar7 = SPxLPBase<double>::rhs(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
          dVar9 = *pdVar7;
          pdVar7 = (double *)infinity();
          dVar2 = *pdVar7;
          SPxSimplifier<double>::tolerances
                    ((SPxSimplifier<double> *)
                     CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
          peVar8 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x2b37b0);
          RVar10 = Tolerances::epsilon(peVar8);
          bVar4 = LT<double,double,double>(dVar9,dVar2,RVar10);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x2b37f7);
          if (bVar4) {
            if (dVar11 <= 0.0) {
              if (dVar11 < 0.0) {
                pdVar7 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                                    in_stack_fffffffffffffaec);
                *pdVar7 = *pdVar7 + 1.0;
              }
            }
            else {
              pdVar7 = VectorBase<double>::operator[]
                                 ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                                  in_stack_fffffffffffffaec);
              *pdVar7 = *pdVar7 + 1.0;
            }
          }
        }
      }
      else {
        pdVar7 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                            in_stack_fffffffffffffaec);
        *pdVar7 = *pdVar7 + 1.0;
        pdVar7 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                            in_stack_fffffffffffffaec);
        *pdVar7 = *pdVar7 + 1.0;
      }
    }
    pdVar7 = SPxLPBase<double>::lower(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    local_160 = *pdVar7;
    pdVar7 = SPxLPBase<double>::upper(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    local_168 = *pdVar7;
    pdVar7 = (double *)infinity();
    dVar11 = *pdVar7;
    SPxSimplifier<double>::tolerances
              ((SPxSimplifier<double> *)
               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    peVar8 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2b399a);
    RVar10 = Tolerances::epsilon(peVar8);
    bVar4 = LE<double,double,double>(local_160,-dVar11,RVar10);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2b39e1);
    if (bVar4) {
      local_3c0 = local_168;
      if (-local_e0 < local_168) {
        local_3c0 = -local_e0;
      }
      local_160 = local_3c0;
    }
    pdVar7 = (double *)infinity();
    dVar11 = *pdVar7;
    SPxSimplifier<double>::tolerances
              ((SPxSimplifier<double> *)
               CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
    peVar8 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2b3ae5);
    RVar10 = Tolerances::epsilon(peVar8);
    bVar4 = GE<double,double,double>(local_168,dVar11,RVar10);
    std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2b3b2c);
    if (bVar4) {
      pdVar7 = SPxLPBase<double>::lower(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
      if (*pdVar7 <= local_e0) {
        local_400 = local_e0;
      }
      else {
        pdVar7 = SPxLPBase<double>::lower(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
        local_400 = *pdVar7;
      }
      local_168 = local_400;
    }
    if (bVar3) {
      dVar11 = feastol(in_stack_fffffffffffffb10);
      bVar4 = LE<double,double,double>(local_160,0.0,dVar11);
      if (bVar4) {
        dVar11 = feastol(in_stack_fffffffffffffb10);
        bVar4 = GE<double,double,double>(local_168,0.0,dVar11);
        if (bVar4) {
          pdVar7 = VectorBase<double>::operator[]
                             ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                              in_stack_fffffffffffffaec);
          *pdVar7 = 0.0;
          goto LAB_002b3ccd;
        }
      }
      bVar3 = false;
    }
LAB_002b3ccd:
    pdVar7 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    *pdVar7 = local_160;
    pdVar7 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    *pdVar7 = local_168;
    pdVar7 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    dVar11 = *pdVar7;
    pdVar7 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    if (dVar11 < *pdVar7 || dVar11 == *pdVar7) {
      pdVar7 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec)
      ;
      dVar11 = *pdVar7;
      pdVar7 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec)
      ;
      if (*pdVar7 <= dVar11) {
        in_stack_fffffffffffffb58 = (SPxMainSM<double> *)((local_160 + local_168) * 0.5);
        pdVar7 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                            in_stack_fffffffffffffaec);
        *pdVar7 = (double)in_stack_fffffffffffffb58;
      }
      else {
        pdVar7 = VectorBase<double>::operator[]
                           ((VectorBase<double> *)in_stack_fffffffffffffaf0,
                            in_stack_fffffffffffffaec);
        *pdVar7 = local_160;
      }
    }
    else {
      pdVar7 = VectorBase<double>::operator[]
                         ((VectorBase<double> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec)
      ;
      *pdVar7 = local_168;
    }
    pdVar7 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    in_stack_fffffffffffffb48 = (VectorBase<double> *)*pdVar7;
    in_stack_fffffffffffffb50 =
         (SPxLPBase<double> *)
         VectorBase<double>::operator[]
                   ((VectorBase<double> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    local_c0 = local_c0 +
               (double)in_stack_fffffffffffffb48 *
               (double)(in_stack_fffffffffffffb50->super_LPRowSetBase<double>).
                       super_SVSetBase<double>.super_ClassArray<soplex::Nonzero<double>_>.
                       _vptr_ClassArray;
    pdVar7 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    dVar11 = *pdVar7;
    pdVar7 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    local_c8 = local_c8 + dVar11 * *pdVar7;
    pdVar7 = SPxLPBase<double>::maxObj(in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    dVar11 = *pdVar7;
    pdVar7 = VectorBase<double>::operator[]
                       ((VectorBase<double> *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
    local_d0 = dVar11 * *pdVar7 + local_d0;
  } while( true );
}

Assistant:

void SPxMainSM<R>::trivialHeuristic(SPxLPBase<R>& lp)
{
   VectorBase<R>         zerosol(lp.nCols());  // the zero solution VectorBase<R>
   VectorBase<R>         lowersol(lp.nCols()); // the lower bound solution VectorBase<R>
   VectorBase<R>         uppersol(lp.nCols()); // the upper bound solution VectorBase<R>
   VectorBase<R>         locksol(lp.nCols());  // the locks solution VectorBase<R>

   VectorBase<R>         upLocks(lp.nCols());
   VectorBase<R>         downLocks(lp.nCols());

   R            zeroObj = this->m_objoffset;
   R            lowerObj = this->m_objoffset;
   R            upperObj = this->m_objoffset;
   R            lockObj = this->m_objoffset;

   bool            zerovalid = true;

   R largeValue = R(infinity);

   if(LT(R(1.0 / feastol()), R(infinity), this->tolerances()->epsilon()))
      largeValue = 1.0 / feastol();



   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      upLocks[j] = 0;
      downLocks[j] = 0;

      // computing the locks on the variables
      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         R aij = col.value(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon())
               && LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            upLocks[j]++;
            downLocks[j]++;
         }
         else if(GT(lp.lhs(col.index(k)), R(-infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               downLocks[j]++;
            else if(aij < 0)
               upLocks[j]++;
         }
         else if(LT(lp.rhs(col.index(k)), R(infinity), this->tolerances()->epsilon()))
         {
            if(aij > 0)
               upLocks[j]++;
            else if(aij < 0)
               downLocks[j]++;
         }
      }

      R lower = lp.lower(j);
      R upper = lp.upper(j);

      if(LE(lower, R(-infinity), this->tolerances()->epsilon()))
         lower = SOPLEX_MIN(-largeValue, upper);

      if(GE(upper, R(infinity), this->tolerances()->epsilon()))
         upper = SOPLEX_MAX(lp.lower(j), largeValue);

      if(zerovalid)
      {
         if(LE(lower, R(0.0), feastol()) && GE(upper, R(0.0), feastol()))
            zerosol[j] = 0.0;
         else
            zerovalid = false;
      }

      lowersol[j] = lower;
      uppersol[j] = upper;

      if(downLocks[j] > upLocks[j])
         locksol[j] = upper;
      else if(downLocks[j] < upLocks[j])
         locksol[j] = lower;
      else
         locksol[j] = (lower + upper) / 2.0;

      lowerObj += lp.maxObj(j) * lowersol[j];
      upperObj += lp.maxObj(j) * uppersol[j];
      lockObj += lp.maxObj(j) * locksol[j];
   }

   // trying the lower bound solution
   if(checkSolution(lp, lowersol))
   {
      if(lowerObj > m_cutoffbound)
         m_cutoffbound = lowerObj;
   }

   // trying the upper bound solution
   if(checkSolution(lp, uppersol))
   {
      if(upperObj > m_cutoffbound)
         m_cutoffbound = upperObj;
   }

   // trying the zero solution
   if(zerovalid && checkSolution(lp, zerosol))
   {
      if(zeroObj > m_cutoffbound)
         m_cutoffbound = zeroObj;
   }

   // trying the lock solution
   if(checkSolution(lp, locksol))
   {
      if(lockObj > m_cutoffbound)
         m_cutoffbound = lockObj;
   }
}